

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

BOOL __thiscall
Js::SmallSpanSequence::RecordARange
          (SmallSpanSequence *this,SmallSpanSequenceIter *iter,StatementData *data)

{
  int iVar1;
  GrowingArray<unsigned_int,_Memory::HeapAllocator> *this_00;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  ushort uVar5;
  undefined4 *puVar6;
  GrowingUint32HeapArray *pGVar7;
  
  if (data == (StatementData *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x5b1,"(data)","data");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (this->pStatementBuffer == (GrowingUint32HeapArray *)0x0) {
    pGVar7 = JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Create(4);
    this->pStatementBuffer = pGVar7;
    iVar1 = data->sourceBegin;
    this->baseValue = iVar1;
    iter->accumulatedIndex = 0;
    iter->accumulatedSourceBegin = iVar1;
    iter->accumulatedBytecodeBegin = 0;
    iter->indexOfActualOffset = 0;
  }
  uVar4 = GetDiff(this,data->sourceBegin,iter->accumulatedSourceBegin);
  uVar5 = GetDiff(this,data->bytecodeBegin,iter->accumulatedBytecodeBegin);
  this_00 = this->pStatementBuffer;
  JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::EnsureArray(this_00);
  this_00->buffer[this_00->count] = CONCAT22(uVar4,uVar5);
  this_00->count = this_00->count + 1;
  iter->accumulatedSourceBegin = data->sourceBegin;
  iter->accumulatedBytecodeBegin = data->bytecodeBegin;
  return 1;
}

Assistant:

BOOL SmallSpanSequence::RecordARange(SmallSpanSequenceIter &iter, StatementData * data)
    {
        Assert(data);

        if (!this->pStatementBuffer)
        {
            this->pStatementBuffer = JsUtil::GrowingUint32HeapArray::Create(4);
            baseValue = data->sourceBegin;
            Reset(iter);
        }

        SmallSpan span(0);

        span.sourceBegin = GetDiff(data->sourceBegin, iter.accumulatedSourceBegin);
        span.bytecodeBegin = GetDiff(data->bytecodeBegin, iter.accumulatedBytecodeBegin);

        this->pStatementBuffer->Add((uint32)span);

        // Update iterator for the next set

        iter.accumulatedSourceBegin = data->sourceBegin;
        iter.accumulatedBytecodeBegin = data->bytecodeBegin;

        return TRUE;
    }